

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_boundary_chain_methods<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
               (vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                *matrix)

{
  undefined4 local_310;
  ID_index local_30c;
  undefined4 *local_308;
  ID_index *local_300;
  undefined **local_2f8;
  undefined1 local_2f0;
  undefined8 *local_2e8;
  undefined4 **local_2e0;
  undefined **local_2d8;
  undefined1 local_2d0;
  undefined8 *local_2c8;
  ID_index **local_2c0;
  undefined1 local_2b8 [8];
  undefined8 local_2b0;
  shared_count sStack_2a8;
  undefined **local_2a0;
  undefined1 local_298;
  undefined8 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x358);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
  local_300 = &local_30c;
  local_2b8[0] = local_30c == 5;
  local_308 = &local_310;
  local_310 = 5;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_2c0 = &local_300;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x358,1,2,2,"matrix[0].get_pivot()",&local_2d8,"5",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x359);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  local_310 = 6;
  local_2b8[0] = local_30c == 6;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x359,1,2,2,"matrix[1].get_pivot()",&local_2d8,"6",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x35a);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 2);
  local_310 = 6;
  local_2b8[0] = local_30c == 6;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x35a,1,2,2,"matrix[2].get_pivot()",&local_2d8,"6",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x35b);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 3);
  local_310 = 0xffffffff;
  local_2b8[0] = local_30c == 0xffffffff;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x35b,1,2,2,"matrix[3].get_pivot()",&local_2d8,"-1",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x35c);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4);
  local_310 = 5;
  local_2b8[0] = local_30c == 5;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x35c,1,2,2,"matrix[4].get_pivot()",&local_2d8,"5",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x35d);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 5);
  local_310 = 6;
  local_2b8[0] = local_30c == 6;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x35d,1,2,2,"matrix[5].get_pivot()",&local_2d8,"6",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x360);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot_value((matrix->
                                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
  local_310 = 4;
  local_2b8[0] = local_30c == 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00246930;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x360,1,2,2,"matrix[0].get_pivot_value()",&local_2d8,
             "4u",&local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x361);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot_value((matrix->
                                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1);
  local_310 = 1;
  local_2b8[0] = local_30c == 1;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00246930;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x361,1,2,2,"matrix[1].get_pivot_value()",&local_2d8,
             "1u",&local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x362);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot_value((matrix->
                                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2);
  local_310 = 4;
  local_2b8[0] = local_30c == 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00246930;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x362,1,2,2,"matrix[2].get_pivot_value()",&local_2d8,
             "4u",&local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x363);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot_value((matrix->
                                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 3);
  local_310 = 0;
  local_2b8[0] = local_30c == 0;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00246930;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x363,1,2,2,"matrix[3].get_pivot_value()",&local_2d8,
             "0u",&local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x364);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot_value((matrix->
                                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 4);
  local_310 = 4;
  local_2b8[0] = local_30c == 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00246930;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x364,1,2,2,"matrix[4].get_pivot_value()",&local_2d8,
             "4u",&local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x365);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = Gudhi::persistence_matrix::
              Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              ::get_pivot_value((matrix->
                                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 5);
  local_310 = 1;
  local_2b8[0] = local_30c == 1;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00246930;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_00246930;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x365,1,2,2,"matrix[5].get_pivot_value()",&local_2d8,
             "1u",&local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x368);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = (((matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->super_Column_dimension_option).dim_;
  local_2b8[0] = local_30c == 4;
  local_310 = 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002466b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x368,1,2,2,"matrix[0].get_dimension()",&local_2d8,"4",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x369);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1].super_Column_dimension_option.dim_;
  local_2b8[0] = local_30c == 4;
  local_310 = 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002466b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x369,1,2,2,"matrix[1].get_dimension()",&local_2d8,"4",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x36a);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_2b8[0] = local_30c == 4;
  local_310 = 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002466b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x36a,1,2,2,"matrix[2].get_dimension()",&local_2d8,"4",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x36b);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[3].super_Column_dimension_option.dim_;
  local_2b8[0] = local_30c == 4;
  local_310 = 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002466b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x36b,1,2,2,"matrix[3].get_dimension()",&local_2d8,"4",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x36c);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[4].super_Column_dimension_option.dim_;
  local_2b8[0] = local_30c == 4;
  local_310 = 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002466b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x36c,1,2,2,"matrix[4].get_dimension()",&local_2d8,"4",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x36d);
  local_298 = 0;
  local_2a0 = &PTR__lazy_ostream_00246430;
  local_290 = &boost::unit_test::lazy_ostream::inst;
  local_288 = "";
  local_30c = (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[5].super_Column_dimension_option.dim_;
  local_2b8[0] = local_30c == 4;
  local_310 = 4;
  local_2b0 = 0;
  sStack_2a8.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_278 = "";
  local_300 = &local_30c;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002466b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = &local_310;
  local_2f0 = 0;
  local_2f8 = &PTR__lazy_ostream_002466b0;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_2b8,&local_2a0,&local_280,0x36d,1,2,2,"matrix[5].get_dimension()",&local_2d8,"4",
             &local_2f8);
  boost::detail::shared_count::~shared_count(&sStack_2a8);
  return;
}

Assistant:

void column_test_boundary_chain_methods(std::vector<Column>& matrix) {
  BOOST_CHECK_EQUAL(matrix[0].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[1].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[2].get_pivot(), 6);
  BOOST_CHECK_EQUAL(matrix[3].get_pivot(), -1);
  BOOST_CHECK_EQUAL(matrix[4].get_pivot(), 5);
  BOOST_CHECK_EQUAL(matrix[5].get_pivot(), 6);

  if constexpr (!is_z2<Column>()) {
    BOOST_CHECK_EQUAL(matrix[0].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[1].get_pivot_value(), 1u);
    BOOST_CHECK_EQUAL(matrix[2].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[3].get_pivot_value(), 0u);
    BOOST_CHECK_EQUAL(matrix[4].get_pivot_value(), 4u);
    BOOST_CHECK_EQUAL(matrix[5].get_pivot_value(), 1u);
  }

  BOOST_CHECK_EQUAL(matrix[0].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[1].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[2].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[3].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[4].get_dimension(), 4);
  BOOST_CHECK_EQUAL(matrix[5].get_dimension(), 4);
}